

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

bool google::protobuf::internal::EpsCopyInputStream::ParseEndsInSlopRegion<false>
               (char *begin,int overrun,int depth)

{
  int line;
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  LogMessageFatal LStack_28;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(overrun,0,"overrun >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (overrun,0x10,"overrun <= kSlopBytes");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      bVar1 = anon_unknown_0::ParsingEndsInBuffer(begin + overrun,begin + 0x10,depth);
      return bVar1;
    }
    line = 0x5a;
  }
  else {
    line = 0x59;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

bool EpsCopyInputStream::ParseEndsInSlopRegion(const char* begin, int overrun,
                                               int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  ABSL_DCHECK_GE(overrun, 0);
  ABSL_DCHECK_LE(overrun, kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  return ParsingEndsInBuffer(ptr, end, depth);
}